

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * duckdb_fmt::v6::internal::
       parse_align<char,duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
                 *handler)

{
  specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  *this;
  basic_format_specs<char> *pbVar1;
  bool bVar2;
  ulong uVar3;
  byte bVar4;
  char *pcVar5;
  size_type __dnew;
  string local_78;
  string local_58;
  size_type local_38;
  
  pcVar5 = begin + 1;
  uVar3 = (ulong)(pcVar5 != end);
  do {
    bVar4 = begin[uVar3];
    if (0x3d < bVar4) {
      if (bVar4 == 0x3e) {
        bVar4 = 2;
      }
      else {
        if (bVar4 != 0x5e) goto LAB_0075cf1b;
        bVar4 = 3;
      }
LAB_0075cf39:
      bVar2 = false;
LAB_0075cf3b:
      if ((int)uVar3 != 0) {
        if (*begin == '{') {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,"invalid fill character \'{\'","");
          specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
          ::on_error(&handler->
                      super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                     ,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p == &local_78.field_2) {
            return begin;
          }
          operator_delete(local_78._M_dataplus._M_p);
          return begin;
        }
        pcVar5 = begin + 2;
        (((handler->
          super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
          ).super_specs_setter<char>.specs_)->fill).data_[0] = *begin;
      }
      if (bVar2) {
        if (0xb < (handler->checker_).arg_type_ - named_arg_type) {
          this = (handler->checker_).error_handler_;
          local_38 = 0x2a;
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          local_58._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
          local_58.field_2._M_allocated_capacity = local_38;
          builtin_strncpy(local_58._M_dataplus._M_p,"format specifier requires numeric argument",
                          0x2a);
          local_58._M_string_length = local_38;
          local_58._M_dataplus._M_p[local_38] = '\0';
          specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
          ::on_error(this,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
        }
        bVar4 = 4;
      }
      pbVar1 = (handler->
               super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
               ).super_specs_setter<char>.specs_;
      pbVar1->field_0x9 = pbVar1->field_0x9 & 0xf0 | bVar4;
      return pcVar5;
    }
    if (bVar4 == 0x3c) {
      bVar4 = 1;
      goto LAB_0075cf39;
    }
    if (bVar4 == 0x3d) {
      bVar4 = 4;
      bVar2 = true;
      goto LAB_0075cf3b;
    }
LAB_0075cf1b:
    bVar2 = (long)uVar3 < 1;
    uVar3 = uVar3 - 1;
    if (bVar2) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR const Char* parse_align(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  int i = 0;
  if (begin + 1 != end) ++i;
  do {
    switch (static_cast<char>(begin[i])) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
#if FMT_NUMERIC_ALIGN
    case '=':
      align = align::numeric;
      break;
#endif
    case '^':
      align = align::center;
      break;
    }
    if (align != align::none) {
      if (i > 0) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        begin += 2;
        handler.on_fill(c);
      } else
        ++begin;
      handler.on_align(align);
      break;
    }
  } while (i-- > 0);
  return begin;
}